

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

Expression *
slang::ast::ConditionalExpression::fromSyntax
          (Compilation *comp,ConditionalExpressionSyntax *syntax,ASTContext *context,
          Type *assignmentTarget)

{
  long lVar1;
  SourceRange range_00;
  SourceRange range_01;
  SourceRange range_02;
  bitmask<slang::ast::ASTFlags> extraFlags;
  SourceRange range_03;
  SourceRange range_04;
  DiagCode code;
  string_view arg;
  string_view arg_00;
  string_view arg_01;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  bitmask<slang::ast::ASTFlags> extraFlags_00;
  bitmask<slang::ast::ASTFlags> extraFlags_01;
  bool bVar2;
  int iVar3;
  ConditionalPredicateSyntax *pCVar4;
  Compilation *pCVar5;
  Type *targetType;
  SVInt *this;
  ASTContext *pAVar6;
  undefined4 extraout_var;
  size_type sVar7;
  reference pCVar8;
  Diagnostic *pDVar9;
  Diagnostic *pDVar10;
  Diagnostic *this_00;
  Expression *pEVar11;
  SourceLocation startLoc;
  SourceLocation endLoc;
  Type *in_RDX;
  EVP_PKEY_CTX *src;
  long in_RSI;
  Compilation *in_RDI;
  string_view sVar12;
  SourceRange range;
  Diagnostic *diag_1;
  string_view opStr;
  BinaryExpression *binOp;
  Diagnostic *diag;
  Type *common;
  bool good;
  ConditionalExpression *result;
  Type *resultType;
  Type *rt;
  Type *lt;
  Expression *right;
  Expression *left;
  bitmask<slang::ast::ASTFlags> rightFlags;
  bitmask<slang::ast::ASTFlags> leftFlags;
  ConstantValue condVal;
  Pattern *pattern;
  Expression *cond;
  ConditionalPatternSyntax *condSyntax;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax> *__range2;
  ASTContext trueContext;
  SmallVector<slang::ast::ConditionalExpression::Condition,_2UL> conditions;
  bool isFourState;
  bool isTrue;
  bool isConst;
  bool bad;
  Condition *in_stack_fffffffffffffa18;
  SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax> *in_stack_fffffffffffffa20;
  Compilation *pCVar13;
  ASTContext *in_stack_fffffffffffffa28;
  SourceLocation __range;
  SourceLocation in_stack_fffffffffffffa30;
  SourceLocation in_stack_fffffffffffffa38;
  undefined4 in_stack_fffffffffffffa40;
  undefined2 in_stack_fffffffffffffa44;
  undefined1 in_stack_fffffffffffffa46;
  undefined1 in_stack_fffffffffffffa47;
  Type *in_stack_fffffffffffffa48;
  Type *in_stack_fffffffffffffa50;
  SourceLocation SVar14;
  DiagCode DVar15;
  Compilation *in_stack_fffffffffffffa58;
  Diagnostic *in_stack_fffffffffffffa60;
  Type *in_stack_fffffffffffffa68;
  Diagnostic *in_stack_fffffffffffffa70;
  Type *in_stack_fffffffffffffa78;
  SourceLocation in_stack_fffffffffffffa80;
  span<slang::ast::ConditionalExpression::Condition,_18446744073709551615UL>
  *in_stack_fffffffffffffa88;
  Type *in_stack_fffffffffffffa90;
  undefined5 in_stack_fffffffffffffa98;
  undefined1 in_stack_fffffffffffffa9d;
  undefined1 in_stack_fffffffffffffa9e;
  undefined1 in_stack_fffffffffffffa9f;
  Expression *in_stack_fffffffffffffaa0;
  ASTContext *in_stack_fffffffffffffaa8;
  SourceRange *in_stack_fffffffffffffab0;
  bool *in_stack_fffffffffffffab8;
  bool *in_stack_fffffffffffffac0;
  bool local_44a;
  char **in_stack_fffffffffffffbe8;
  undefined5 in_stack_fffffffffffffbf8;
  undefined1 uVar16;
  undefined1 in_stack_fffffffffffffbfe;
  undefined1 in_stack_fffffffffffffbff;
  undefined4 in_stack_fffffffffffffc08;
  undefined1 in_stack_fffffffffffffc0c;
  undefined1 in_stack_fffffffffffffc0d;
  undefined1 in_stack_fffffffffffffc0e;
  undefined1 in_stack_fffffffffffffc0f;
  Type *in_stack_fffffffffffffc10;
  SourceRange local_2f8;
  SourceLocation local_2e8;
  SourceLocation SStack_2e0;
  string_view local_2d8;
  string_view local_2c8;
  SourceLocation local_2b8;
  undefined4 local_2ac;
  Diagnostic *local_2a8;
  string_view local_2a0;
  BinaryExpression *local_290;
  SourceLocation local_288;
  SourceLocation SStack_280;
  SourceLocation local_278;
  SourceLocation SStack_270;
  SourceLocation local_268;
  undefined4 local_25c;
  Diagnostic *local_258;
  Type *local_250;
  not_null<const_slang::ast::Type_*> local_248;
  not_null<const_slang::ast::Type_*> in_stack_fffffffffffffdc0;
  not_null<const_slang::ast::Type_*> in_stack_fffffffffffffdc8;
  not_null<const_slang::ast::Type_*> local_230;
  Type *local_228;
  not_null<const_slang::ast::Type_*> local_220;
  not_null<const_slang::ast::Type_*> local_218;
  not_null<const_slang::ast::Type_*> local_210;
  not_null<const_slang::ast::Type_*> local_208;
  Type *local_200;
  not_null<const_slang::ast::Type_*> local_1f8;
  byte local_1ed;
  undefined4 local_1ec;
  SourceRange local_1e8;
  SourceLocation local_1d8;
  ExpressionSyntax *local_1d0;
  SourceLocation local_1c0;
  Type *local_1b8;
  Type *local_1b0;
  Type *local_1a8;
  underlying_type local_1a0;
  Expression *local_198;
  underlying_type local_190;
  Expression *local_188;
  bitmask<slang::ast::ASTFlags> local_180;
  bitmask<slang::ast::ASTFlags> local_178;
  bitmask<slang::ast::ASTFlags> local_170;
  bitmask<slang::ast::ASTFlags> local_168;
  bitmask<slang::ast::ASTFlags> local_160;
  bitmask<slang::ast::ASTFlags> local_158;
  bitmask<slang::ast::ASTFlags> local_150;
  bitmask<slang::ast::ASTFlags> local_148;
  Type *local_140;
  not_null<const_slang::ast::Expression_*> local_138;
  Pattern *local_130;
  Pattern *local_100;
  bitmask<slang::ast::ASTFlags> local_f8;
  Type *local_f0;
  Compilation *local_e8;
  iterator local_e0;
  iterator local_d0;
  SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax> *local_b0;
  undefined8 local_a8;
  size_t sStack_a0;
  char *local_98;
  SourceLocation SStack_90;
  Scope *local_88;
  Symbol *pSStack_80;
  undefined8 local_78;
  SmallVectorBase<slang::ast::ConditionalExpression::Condition> local_68;
  byte local_2c;
  byte local_2b;
  undefined1 local_2a [34];
  SourceLocation local_8;
  
  local_2a[1] = 0;
  local_2a[0] = 1;
  local_2b = 1;
  local_2c = 0;
  local_2a._10_8_ = in_RDX;
  local_2a._18_8_ = in_RSI;
  local_2a._26_8_ = in_RDI;
  SmallVector<slang::ast::ConditionalExpression::Condition,_2UL>::SmallVector
            ((SmallVector<slang::ast::ConditionalExpression::Condition,_2UL> *)0xa3db14);
  local_78 = *(undefined8 *)&((Symbol *)local_2a._10_8_)->indexInScope;
  local_a8 = *(undefined8 *)(Symbol *)local_2a._10_8_;
  sStack_a0 = (((Symbol *)local_2a._10_8_)->name)._M_len;
  local_98 = (((Symbol *)local_2a._10_8_)->name)._M_str;
  SStack_90 = ((Symbol *)local_2a._10_8_)->location;
  local_88 = ((Symbol *)local_2a._10_8_)->parentScope;
  pSStack_80 = ((Symbol *)local_2a._10_8_)->nextInScope;
  pCVar4 = not_null<slang::syntax::ConditionalPredicateSyntax_*>::operator->
                     ((not_null<slang::syntax::ConditionalPredicateSyntax_*> *)0xa3db5c);
  local_b0 = &pCVar4->conditions;
  local_d0 = slang::syntax::SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax>::begin
                       ((SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax> *)0xa3db87);
  local_e0 = slang::syntax::SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax>::end
                       (in_stack_fffffffffffffa20);
  while( true ) {
    bVar2 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax>::iterator_base<slang::syntax::ConditionalPatternSyntax_*>_>
                      ((self_type *)in_stack_fffffffffffffa20,
                       (iterator_base<slang::syntax::ConditionalPatternSyntax_*> *)
                       in_stack_fffffffffffffa18);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    pCVar5 = (Compilation *)
             iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax>::iterator_base<slang::syntax::ConditionalPatternSyntax_*>,_false>
             ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax>::iterator_base<slang::syntax::ConditionalPatternSyntax_*>,_false>
                          *)0xa3dc35);
    pCVar13 = (Compilation *)local_2a._26_8_;
    local_e8 = pCVar5;
    pAVar6 = (ASTContext *)
             not_null<slang::syntax::ExpressionSyntax_*>::operator*
                       ((not_null<slang::syntax::ExpressionSyntax_*> *)0xa3dc70);
    bitmask<slang::ast::ASTFlags>::bitmask(&local_f8,None);
    extraFlags.m_bits._4_2_ = in_stack_fffffffffffffa44;
    extraFlags.m_bits._0_4_ = in_stack_fffffffffffffa40;
    extraFlags.m_bits._6_1_ = in_stack_fffffffffffffa46;
    extraFlags.m_bits._7_1_ = in_stack_fffffffffffffa47;
    targetType = (Type *)Expression::selfDetermined
                                   ((Compilation *)in_stack_fffffffffffffa38,
                                    (ExpressionSyntax *)in_stack_fffffffffffffa30,
                                    in_stack_fffffffffffffa28,extraFlags);
    local_f0 = targetType;
    bVar2 = Expression::bad((Expression *)in_stack_fffffffffffffa20);
    local_2a[1] = (local_2a[1] & 1) != 0 || bVar2;
    local_100 = (Pattern *)0x0;
    lVar1._0_4_ = (local_e8->options).maxConstexprDepth;
    lVar1._4_4_ = (local_e8->options).maxConstexprSteps;
    if (lVar1 == 0) {
      in_stack_fffffffffffffc10 =
           not_null<const_slang::ast::Type_*>::operator->
                     ((not_null<const_slang::ast::Type_*> *)0xa3de27);
      in_stack_fffffffffffffc0f = Type::isFourState(in_stack_fffffffffffffa78);
      local_2c = (local_2c & 1) != 0 || (bool)in_stack_fffffffffffffc0f;
      if ((local_2a[1] & 1) == 0) {
        in_stack_fffffffffffffc0e =
             ASTContext::requireBooleanConvertible
                       (in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
        if (!(bool)in_stack_fffffffffffffc0e) {
          local_2a[1] = 1;
        }
      }
    }
    else {
      not_null<slang::syntax::PatternSyntax_*>::operator*
                ((not_null<slang::syntax::PatternSyntax_*> *)0xa3dd4d);
      not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0xa3dd68);
      local_100 = createPattern(pCVar5,pAVar6,(PatternSyntax *)pCVar13,targetType);
      bVar2 = Pattern::bad(local_100);
      local_2a[1] = (local_2a[1] & 1) != 0 || bVar2;
      local_2a[0] = 0;
    }
    if (((local_2a[1] & 1) == 0) && ((local_2a[0] & 1) != 0)) {
      ASTContext::tryEval((ASTContext *)in_stack_fffffffffffffdc8.ptr,
                          (Expression *)in_stack_fffffffffffffdc0.ptr);
      in_stack_fffffffffffffc0d =
           slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0xa3def7);
      if ((bool)in_stack_fffffffffffffc0d) {
        in_stack_fffffffffffffc0c = slang::ConstantValue::isInteger((ConstantValue *)0xa3df1a);
        if ((bool)in_stack_fffffffffffffc0c) {
          this = slang::ConstantValue::integer((ConstantValue *)0xa3df3d);
          in_stack_fffffffffffffbff = SVInt::hasUnknown(this);
          if ((bool)in_stack_fffffffffffffbff) goto LAB_00a3df6a;
        }
        in_stack_fffffffffffffbfe =
             slang::ConstantValue::isTrue((ConstantValue *)in_stack_fffffffffffffa20);
        if (!(bool)in_stack_fffffffffffffbfe) {
          local_2b = 0;
        }
      }
      else {
LAB_00a3df6a:
        local_2a[0] = 0;
      }
      slang::ConstantValue::~ConstantValue((ConstantValue *)0xa3dfd4);
    }
    local_140 = local_f0;
    not_null<const_slang::ast::Expression_*>::not_null<slang::ast::Expression_*>
              (&local_138,(Expression **)&local_140);
    local_130 = local_100;
    SmallVectorBase<slang::ast::ConditionalExpression::Condition>::push_back
              ((SmallVectorBase<slang::ast::ConditionalExpression::Condition> *)
               in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax>::iterator_base<slang::syntax::ConditionalPatternSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax>::iterator_base<slang::syntax::ConditionalPatternSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax>::iterator_base<slang::syntax::ConditionalPatternSyntax_*>,_false>
                *)in_stack_fffffffffffffa20);
  }
  bitmask<slang::ast::ASTFlags>::bitmask(&local_148,None);
  bitmask<slang::ast::ASTFlags>::bitmask(&local_150,None);
  if ((local_2a[0] & 1) != 0) {
    if ((local_2b & 1) == 0) {
      bitmask<slang::ast::ASTFlags>::bitmask(&local_160,UnevaluatedBranch);
      local_148.m_bits = local_160.m_bits;
    }
    else {
      bitmask<slang::ast::ASTFlags>::bitmask(&local_158,UnevaluatedBranch);
      local_150.m_bits = local_158.m_bits;
    }
  }
  pCVar13 = (Compilation *)&(((Symbol *)local_2a._10_8_)->name)._M_str;
  bitmask<slang::ast::ASTFlags>::bitmask(&local_168,AllowUnboundedLiteral);
  bVar2 = bitmask<slang::ast::ASTFlags>::has
                    ((bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffa30,
                     (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffa28);
  uVar16 = false;
  if (bVar2) {
    in_stack_fffffffffffffbe8 = &(((Symbol *)local_2a._10_8_)->name)._M_str;
    bitmask<slang::ast::ASTFlags>::bitmask(&local_170,AllowUnboundedLiteralArithmetic);
    uVar16 = bitmask<slang::ast::ASTFlags>::has
                       ((bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffa30,
                        (bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffa28);
  }
  if ((bool)uVar16 != false) {
    bitmask<slang::ast::ASTFlags>::bitmask(&local_178,AllowUnboundedLiteral);
    bitmask<slang::ast::ASTFlags>::operator|=(&local_148,&local_178);
    bitmask<slang::ast::ASTFlags>::bitmask(&local_180,AllowUnboundedLiteral);
    bitmask<slang::ast::ASTFlags>::operator|=(&local_150,&local_180);
  }
  pCVar5 = (Compilation *)local_2a._26_8_;
  pAVar6 = (ASTContext *)
           not_null<slang::syntax::ExpressionSyntax_*>::operator*
                     ((not_null<slang::syntax::ExpressionSyntax_*> *)0xa3e1c1);
  local_190 = local_148.m_bits;
  extraFlags_00.m_bits._5_1_ = uVar16;
  extraFlags_00.m_bits._0_5_ = in_stack_fffffffffffffbf8;
  extraFlags_00.m_bits._6_1_ = in_stack_fffffffffffffbfe;
  extraFlags_00.m_bits._7_1_ = in_stack_fffffffffffffbff;
  local_188 = Expression::create(pCVar13,(ExpressionSyntax *)in_stack_fffffffffffffbe8,pAVar6,
                                 extraFlags_00,(Type *)pCVar5);
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0xa3e243);
  local_1a0 = local_150.m_bits;
  extraFlags_01.m_bits._5_1_ = uVar16;
  extraFlags_01.m_bits._0_5_ = in_stack_fffffffffffffbf8;
  extraFlags_01.m_bits._6_1_ = in_stack_fffffffffffffbfe;
  extraFlags_01.m_bits._7_1_ = in_stack_fffffffffffffbff;
  local_198 = Expression::create(pCVar13,(ExpressionSyntax *)in_stack_fffffffffffffbe8,pAVar6,
                                 extraFlags_01,(Type *)pCVar5);
  bVar2 = Expression::bad((Expression *)in_stack_fffffffffffffa20);
  local_44a = true;
  if (!bVar2) {
    local_44a = Expression::bad((Expression *)in_stack_fffffffffffffa20);
  }
  local_2a[1] = local_2a[1] & 1 | local_44a;
  local_1a8 = not_null::operator_cast_to_Type_((not_null<const_slang::ast::Type_*> *)0xa3e321);
  local_1b0 = not_null::operator_cast_to_Type_((not_null<const_slang::ast::Type_*> *)0xa3e34c);
  bVar2 = Type::isUnbounded((Type *)0xa3e373);
  if (bVar2) {
    local_1a8 = Compilation::getIntType((Compilation *)local_2a._26_8_);
  }
  bVar2 = Type::isUnbounded((Type *)0xa3e3bd);
  if (bVar2) {
    local_1b0 = Compilation::getIntType((Compilation *)local_2a._26_8_);
  }
  local_1b8 = OpInfo::binaryType(in_stack_fffffffffffffa58,in_stack_fffffffffffffa50,
                                 in_stack_fffffffffffffa48,(bool)in_stack_fffffffffffffa47,
                                 (bool)in_stack_fffffffffffffa46);
  iVar3 = SmallVectorBase<slang::ast::ConditionalExpression::Condition>::copy
                    (&local_68,(EVP_PKEY_CTX *)local_2a._26_8_,src);
  local_1d0 = (ExpressionSyntax *)CONCAT44(extraout_var,iVar3);
  local_1d8 = parsing::Token::location((Token *)(local_2a._18_8_ + 0x20));
  local_1e8 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffffa70);
  __range = (SourceLocation)&local_2b;
  pCVar13 = (Compilation *)local_2a;
  pEVar11 = (Expression *)&local_1e8;
  local_1c0 = (SourceLocation)
              BumpAllocator::
              emplace<slang::ast::ConditionalExpression,slang::ast::Type_const&,std::span<slang::ast::ConditionalExpression::Condition,18446744073709551615ul>,slang::SourceLocation,slang::ast::Expression&,slang::ast::Expression&,slang::SourceRange,bool&,bool&>
                        ((BumpAllocator *)
                         CONCAT17(in_stack_fffffffffffffa9f,
                                  CONCAT16(in_stack_fffffffffffffa9e,
                                           CONCAT15(in_stack_fffffffffffffa9d,
                                                    in_stack_fffffffffffffa98))),
                         in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
                         (SourceLocation *)in_stack_fffffffffffffa80,
                         (Expression *)in_stack_fffffffffffffa78,
                         (Expression *)in_stack_fffffffffffffa70,in_stack_fffffffffffffab0,
                         in_stack_fffffffffffffab8,in_stack_fffffffffffffac0);
  if ((local_2a[1] & 1) != 0) {
    local_8 = (SourceLocation)Expression::badExpr(pCVar13,pEVar11);
    goto LAB_00a3f0e8;
  }
  local_1ed = 1;
  bVar2 = Type::isNumeric((Type *)pCVar13);
  if (bVar2) {
    bVar2 = Type::isNumeric((Type *)pCVar13);
    if (!bVar2) goto LAB_00a3e638;
    goto LAB_00a3eb85;
  }
LAB_00a3e638:
  bVar2 = Type::isNull((Type *)0xa3e645);
  if (bVar2) {
    bVar2 = Type::isNull((Type *)0xa3e668);
    if (bVar2) {
      local_200 = Compilation::getNullType((Compilation *)0xa3e68b);
      not_null<const_slang::ast::Type_*>::not_null<const_slang::ast::Type_*>(&local_1f8,&local_200);
      ((not_null<const_slang::ast::Type_*> *)((long)local_1c0 + 8))->ptr = local_1f8.ptr;
      goto LAB_00a3eb85;
    }
  }
  bVar2 = Type::isClass((Type *)0xa3e6e2);
  if (bVar2) {
LAB_00a3e84e:
    bVar2 = Type::isNull((Type *)0xa3e85b);
    if (bVar2) {
      not_null<const_slang::ast::Type_*>::not_null<const_slang::ast::Type_*&>(&local_208,&local_1b0)
      ;
      ((not_null<const_slang::ast::Type_*> *)((long)local_1c0 + 8))->ptr = local_208.ptr;
    }
    else {
      bVar2 = Type::isNull((Type *)0xa3e8ae);
      if (bVar2) {
        not_null<const_slang::ast::Type_*>::not_null<const_slang::ast::Type_*&>
                  (&local_210,&local_1a8);
        ((not_null<const_slang::ast::Type_*> *)((long)local_1c0 + 8))->ptr = local_210.ptr;
      }
      else {
        bVar2 = Type::isAssignmentCompatible
                          (in_stack_fffffffffffffa78,(Type *)in_stack_fffffffffffffa70);
        if (bVar2) {
          not_null<const_slang::ast::Type_*>::not_null<const_slang::ast::Type_*&>
                    (&local_218,&local_1b0);
          ((not_null<const_slang::ast::Type_*> *)((long)local_1c0 + 8))->ptr = local_218.ptr;
        }
        else {
          bVar2 = Type::isAssignmentCompatible
                            (in_stack_fffffffffffffa78,(Type *)in_stack_fffffffffffffa70);
          if (bVar2) {
            not_null<const_slang::ast::Type_*>::not_null<const_slang::ast::Type_*&>
                      (&local_220,&local_1a8);
            ((not_null<const_slang::ast::Type_*> *)((long)local_1c0 + 8))->ptr = local_220.ptr;
          }
          else {
            local_228 = Type::getCommonBase(in_stack_fffffffffffffc10,
                                            (Type *)CONCAT17(in_stack_fffffffffffffc0f,
                                                             CONCAT16(in_stack_fffffffffffffc0e,
                                                                      CONCAT15(
                                                  in_stack_fffffffffffffc0d,
                                                  CONCAT14(in_stack_fffffffffffffc0c,
                                                           in_stack_fffffffffffffc08)))));
            if (local_228 == (Type *)0x0) {
              bVar2 = Type::isEquivalent(in_stack_fffffffffffffa78,(Type *)in_stack_fffffffffffffa70
                                        );
              if (bVar2) {
                not_null<const_slang::ast::Type_*>::not_null<const_slang::ast::Type_*&>
                          ((not_null<const_slang::ast::Type_*> *)&stack0xfffffffffffffdc8,&local_1a8
                          );
                ((not_null<const_slang::ast::Type_*> *)((long)local_1c0 + 8))->ptr =
                     in_stack_fffffffffffffdc8.ptr;
              }
              else {
                local_1ed = 0;
              }
            }
            else {
              not_null<const_slang::ast::Type_*>::not_null<const_slang::ast::Type_*&>
                        (&local_230,&local_228);
              ((not_null<const_slang::ast::Type_*> *)((long)local_1c0 + 8))->ptr = local_230.ptr;
            }
          }
        }
      }
    }
  }
  else {
    bVar2 = Type::isClass((Type *)0xa3e709);
    if (bVar2) goto LAB_00a3e84e;
    bVar2 = Type::isCHandle((Type *)0xa3e730);
    if (bVar2) goto LAB_00a3e84e;
    bVar2 = Type::isCHandle((Type *)0xa3e757);
    if (bVar2) goto LAB_00a3e84e;
    bVar2 = Type::isEvent((Type *)0xa3e77e);
    if (bVar2) goto LAB_00a3e84e;
    bVar2 = Type::isEvent((Type *)0xa3e7a5);
    if (bVar2) goto LAB_00a3e84e;
    bVar2 = Type::isVirtualInterface((Type *)0xa3e7cc);
    if (bVar2) goto LAB_00a3e84e;
    bVar2 = Type::isVirtualInterface((Type *)0xa3e7ef);
    if (bVar2) goto LAB_00a3e84e;
    bVar2 = Type::isCovergroup((Type *)0xa3e812);
    if (bVar2) goto LAB_00a3e84e;
    bVar2 = Type::isCovergroup((Type *)0xa3e835);
    if (bVar2) goto LAB_00a3e84e;
    bVar2 = Type::isEquivalent(in_stack_fffffffffffffa78,(Type *)in_stack_fffffffffffffa70);
    if (bVar2) {
      not_null<const_slang::ast::Type_*>::not_null<const_slang::ast::Type_*&>
                ((not_null<const_slang::ast::Type_*> *)&stack0xfffffffffffffdc0,&local_1a8);
      ((not_null<const_slang::ast::Type_*> *)((long)local_1c0 + 8))->ptr =
           in_stack_fffffffffffffdc0.ptr;
    }
    else {
      bVar2 = Expression::isImplicitString((Expression *)in_stack_fffffffffffffaa8);
      if (bVar2) {
        bVar2 = Expression::isImplicitString((Expression *)in_stack_fffffffffffffaa8);
        if (bVar2) {
          local_250 = Compilation::getStringType((Compilation *)local_2a._26_8_);
          not_null<const_slang::ast::Type_*>::not_null<const_slang::ast::Type_*>
                    (&local_248,&local_250);
          ((not_null<const_slang::ast::Type_*> *)((long)local_1c0 + 8))->ptr = local_248.ptr;
          goto LAB_00a3eb85;
        }
      }
      local_1ed = 0;
    }
  }
LAB_00a3eb85:
  if ((local_1ed & 1) == 0) {
    local_25c = 0x220007;
    local_268 = parsing::Token::location((Token *)(local_2a._18_8_ + 0x20));
    DVar15.code._0_1_ = in_stack_fffffffffffffa46;
    DVar15.subsystem = in_stack_fffffffffffffa44;
    DVar15.code._1_1_ = in_stack_fffffffffffffa47;
    local_258 = ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffa30,DVar15,
                                    in_stack_fffffffffffffa38);
    ast::operator<<(in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
    ast::operator<<(in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
    local_278 = (local_188->sourceRange).startLoc;
    SStack_270 = (local_188->sourceRange).endLoc;
    range_00.endLoc = in_stack_fffffffffffffa30;
    range_00.startLoc = __range;
    Diagnostic::operator<<((Diagnostic *)pCVar13,range_00);
    local_288 = (local_198->sourceRange).startLoc;
    SStack_280 = (local_198->sourceRange).endLoc;
    range_01.endLoc = in_stack_fffffffffffffa30;
    range_01.startLoc = __range;
    Diagnostic::operator<<((Diagnostic *)pCVar13,range_01);
    local_8 = (SourceLocation)Expression::badExpr(pCVar13,pEVar11);
    goto LAB_00a3f0e8;
  }
  sVar7 = SmallVectorBase<slang::ast::ConditionalExpression::Condition>::size(&local_68);
  sVar12._M_str = (char *)in_stack_fffffffffffffa88;
  sVar12._M_len = (size_t)in_stack_fffffffffffffa90;
  if (sVar7 == 1) {
    pCVar8 = SmallVectorBase<slang::ast::ConditionalExpression::Condition>::operator[](&local_68,0);
    sVar12._M_str = (char *)in_stack_fffffffffffffa88;
    sVar12._M_len = (size_t)in_stack_fffffffffffffa90;
    if (pCVar8->pattern == (Pattern *)0x0) {
      SmallVectorBase<slang::ast::ConditionalExpression::Condition>::operator[](&local_68,0);
      not_null<const_slang::ast::Expression_*>::operator->
                ((not_null<const_slang::ast::Expression_*> *)0xa3ed57);
      local_290 = Expression::as_if<slang::ast::BinaryExpression>(pEVar11);
      sVar12._M_str = (char *)in_stack_fffffffffffffa88;
      sVar12._M_len = (size_t)in_stack_fffffffffffffa90;
      if (local_290 != (BinaryExpression *)0x0) {
        bVar2 = Expression::isParenthesized(&local_290->super_Expression);
        sVar12._M_str = (char *)in_stack_fffffffffffffa88;
        sVar12._M_len = (size_t)in_stack_fffffffffffffa90;
        if (!bVar2) {
          bVar2 = OpInfo::isArithmetic(local_290->op);
          if (!bVar2) {
            bVar2 = OpInfo::isShift(local_290->op);
            sVar12._M_str = (char *)in_stack_fffffffffffffa88;
            sVar12._M_len = (size_t)in_stack_fffffffffffffa90;
            if (!bVar2) goto LAB_00a3f079;
          }
          sVar12 = OpInfo::getText((BinaryOperator)((ulong)pCVar13 >> 0x20));
          local_2ac = 0xbc0007;
          in_stack_fffffffffffffa78 = (Type *)local_2a._10_8_;
          local_2a0 = sVar12;
          in_stack_fffffffffffffa80 = parsing::Token::location((Token *)(local_2a._18_8_ + 0x20));
          code.code._0_1_ = in_stack_fffffffffffffa46;
          code.subsystem = in_stack_fffffffffffffa44;
          code.code._1_1_ = in_stack_fffffffffffffa47;
          local_2b8 = in_stack_fffffffffffffa80;
          pDVar9 = ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffa30,code,
                                       in_stack_fffffffffffffa38);
          arg._M_str = (char *)pDVar9;
          arg._M_len = (size_t)in_stack_fffffffffffffa68;
          local_2a8 = pDVar9;
          local_2c8 = local_2a0;
          pDVar10 = Diagnostic::operator<<(in_stack_fffffffffffffa60,arg);
          arg_00._M_str = (char *)pDVar9;
          arg_00._M_len = (size_t)pDVar10;
          local_2d8 = local_2a0;
          this_00 = Diagnostic::operator<<(in_stack_fffffffffffffa60,arg_00);
          local_2e8 = (local_290->super_Expression).sourceRange.startLoc;
          SStack_2e0 = (local_290->super_Expression).sourceRange.endLoc;
          range_02.endLoc = in_stack_fffffffffffffa30;
          range_02.startLoc = __range;
          Diagnostic::operator<<((Diagnostic *)pCVar13,range_02);
          pEVar11 = BinaryExpression::right(local_290);
          startLoc = SourceRange::start(&pEVar11->sourceRange);
          SVar14 = startLoc;
          endLoc = SourceRange::end(&local_198->sourceRange);
          DVar15 = SVar14._4_4_;
          SourceRange::SourceRange(&local_2f8,startLoc,endLoc);
          range_03.startLoc._4_2_ = in_stack_fffffffffffffa44;
          range_03.startLoc._0_4_ = in_stack_fffffffffffffa40;
          range_03.startLoc._6_1_ = in_stack_fffffffffffffa46;
          range_03.startLoc._7_1_ = in_stack_fffffffffffffa47;
          range_03.endLoc = endLoc;
          Diagnostic::addNote((Diagnostic *)in_stack_fffffffffffffa38,DVar15,range_03);
          range_04.startLoc._4_2_ = in_stack_fffffffffffffa44;
          range_04.startLoc._0_4_ = in_stack_fffffffffffffa40;
          range_04.startLoc._6_1_ = in_stack_fffffffffffffa46;
          range_04.startLoc._7_1_ = in_stack_fffffffffffffa47;
          range_04.endLoc = endLoc;
          Diagnostic::addNote((Diagnostic *)in_stack_fffffffffffffa38,DVar15,range_04);
          arg_01._M_str = (char *)pDVar9;
          arg_01._M_len = (size_t)pDVar10;
          Diagnostic::operator<<(this_00,arg_01);
        }
      }
    }
  }
LAB_00a3f079:
  std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
  span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
            ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *)
             local_2a._10_8_,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)__range);
  syntax_00._M_extent._M_extent_value = sVar12._M_len;
  syntax_00._M_ptr = (pointer)sVar12._M_str;
  ASTContext::setAttributes
            ((ASTContext *)in_stack_fffffffffffffa80,(Expression *)in_stack_fffffffffffffa78,
             syntax_00);
  local_8 = local_1c0;
LAB_00a3f0e8:
  local_1ec = 1;
  SmallVector<slang::ast::ConditionalExpression::Condition,_2UL>::~SmallVector
            ((SmallVector<slang::ast::ConditionalExpression::Condition,_2UL> *)0xa3f0f5);
  return (Expression *)local_8;
}

Assistant:

Expression& ConditionalExpression::fromSyntax(Compilation& comp,
                                              const ConditionalExpressionSyntax& syntax,
                                              const ASTContext& context,
                                              const Type* assignmentTarget) {
    bool bad = false;
    bool isConst = true;
    bool isTrue = true;
    bool isFourState = false;
    SmallVector<Condition> conditions;
    ASTContext trueContext = context;

    for (auto condSyntax : syntax.predicate->conditions) {
        auto& cond = selfDetermined(comp, *condSyntax->expr, trueContext);
        bad |= cond.bad();

        const Pattern* pattern = nullptr;
        if (condSyntax->matchesClause) {
            pattern = createPattern(comp, trueContext, *condSyntax->matchesClause->pattern,
                                    *cond.type);
            bad |= pattern->bad();

            // We don't consider the condition to be const if there's a pattern.
            isConst = false;
        }
        else {
            isFourState |= cond.type->isFourState();
            if (!bad && !trueContext.requireBooleanConvertible(cond))
                bad = true;
        }

        if (!bad && isConst) {
            ConstantValue condVal = trueContext.tryEval(cond);
            if (!condVal || (condVal.isInteger() && condVal.integer().hasUnknown()))
                isConst = false;
            else if (!condVal.isTrue())
                isTrue = false;
        }

        conditions.push_back({&cond, pattern});
    }

    // If the predicate is known at compile time, we can tell which branch will be unevaluated.
    bitmask<ASTFlags> leftFlags = ASTFlags::None;
    bitmask<ASTFlags> rightFlags = ASTFlags::None;
    if (isConst) {
        if (isTrue)
            rightFlags = ASTFlags::UnevaluatedBranch;
        else
            leftFlags = ASTFlags::UnevaluatedBranch;
    }

    // Pass through the flag allowing unbounded literals.
    if (context.flags.has(ASTFlags::AllowUnboundedLiteral) &&
        context.flags.has(ASTFlags::AllowUnboundedLiteralArithmetic)) {
        leftFlags |= ASTFlags::AllowUnboundedLiteral;
        rightFlags |= ASTFlags::AllowUnboundedLiteral;
    }

    auto& left = create(comp, *syntax.left, trueContext, leftFlags, assignmentTarget);
    auto& right = create(comp, *syntax.right, context, rightFlags, assignmentTarget);
    bad |= left.bad() || right.bad();

    const Type* lt = left.type;
    const Type* rt = right.type;
    if (lt->isUnbounded())
        lt = &comp.getIntType();
    if (rt->isUnbounded())
        rt = &comp.getIntType();

    // Force four-state return type for ambiguous condition case.
    const Type* resultType = OpInfo::binaryType(comp, lt, rt, isFourState);
    auto result = comp.emplace<ConditionalExpression>(*resultType, conditions.copy(comp),
                                                      syntax.question.location(), left, right,
                                                      syntax.sourceRange(), isConst, isTrue);
    if (bad)
        return badExpr(comp, result);

    // If both sides of the expression are numeric, we've already determined the correct
    // result type. Otherwise, follow the rules in [11.14.11].
    bool good = true;
    if (!lt->isNumeric() || !rt->isNumeric()) {
        if (lt->isNull() && rt->isNull()) {
            result->type = &comp.getNullType();
        }
        else if (lt->isClass() || rt->isClass() || lt->isCHandle() || rt->isCHandle() ||
                 lt->isEvent() || rt->isEvent() || lt->isVirtualInterface() ||
                 rt->isVirtualInterface() || lt->isCovergroup() || rt->isCovergroup()) {
            if (lt->isNull())
                result->type = rt;
            else if (rt->isNull())
                result->type = lt;
            else if (rt->isAssignmentCompatible(*lt))
                result->type = rt;
            else if (lt->isAssignmentCompatible(*rt))
                result->type = lt;
            else if (auto common = Type::getCommonBase(*lt, *rt))
                result->type = common;
            else if (lt->isEquivalent(*rt))
                result->type = lt;
            else
                good = false;
        }
        else if (lt->isEquivalent(*rt)) {
            result->type = lt;
        }
        else if (left.isImplicitString() && right.isImplicitString()) {
            result->type = &comp.getStringType();
        }
        else {
            good = false;
        }
    }

    if (!good) {
        auto& diag = context.addDiag(diag::BadConditionalExpression, syntax.question.location());
        diag << *lt << *rt;
        diag << left.sourceRange;
        diag << right.sourceRange;
        return badExpr(comp, result);
    }

    // Warn about cases where a conditional expression and a binary operator
    // are mixed in a way that suggests the user mixed up the precedence order.
    // ex: `a + b ? 1 : 2`
    if (conditions.size() == 1 && !conditions[0].pattern) {
        if (auto binOp = conditions[0].expr->as_if<BinaryExpression>();
            binOp && !binOp->isParenthesized()) {
            if (OpInfo::isArithmetic(binOp->op) || OpInfo::isShift(binOp->op)) {
                auto opStr = OpInfo::getText(binOp->op);
                auto& diag = context.addDiag(diag::ConditionalPrecedence,
                                             syntax.question.location());
                diag << opStr << opStr << binOp->sourceRange;

                SourceRange range(binOp->right().sourceRange.start(), right.sourceRange.end());
                diag.addNote(diag::NoteConditionalPrecedenceFix, range);
                diag.addNote(diag::NotePrecedenceSilence, binOp->sourceRange) << opStr;
            }
        }
    }

    context.setAttributes(*result, syntax.attributes);
    return *result;
}